

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# region_grow.cpp
# Opt level: O2

int __thiscall
rg::RGProblem::getInnerObstacles
          (RGProblem *this,Vector3i *upper_vertex,Vector3i *lower_vertex,
          vector<Eigen::Matrix<int,_3,_1,_0,_3,_1>,_std::allocator<Eigen::Matrix<int,_3,_1,_0,_3,_1>_>_>
          *obstacles)

{
  int iVar1;
  pointer pMVar2;
  value_type *__x;
  
  pMVar2 = (obstacles->
           super__Vector_base<Eigen::Matrix<int,_3,_1,_0,_3,_1>,_std::allocator<Eigen::Matrix<int,_3,_1,_0,_3,_1>_>_>
           )._M_impl.super__Vector_impl_data._M_start;
  if ((obstacles->
      super__Vector_base<Eigen::Matrix<int,_3,_1,_0,_3,_1>,_std::allocator<Eigen::Matrix<int,_3,_1,_0,_3,_1>_>_>
      )._M_impl.super__Vector_impl_data._M_finish != pMVar2) {
    (obstacles->
    super__Vector_base<Eigen::Matrix<int,_3,_1,_0,_3,_1>,_std::allocator<Eigen::Matrix<int,_3,_1,_0,_3,_1>_>_>
    )._M_impl.super__Vector_impl_data._M_finish = pMVar2;
  }
  __x = *(value_type **)this;
  do {
    iVar1 = (__x->super_PlainObjectBase<Eigen::Matrix<int,_3,_1,_0,_3,_1>_>).m_storage.m_data.array
            [0];
    if ((((iVar1 <= (upper_vertex->super_PlainObjectBase<Eigen::Matrix<int,_3,_1,_0,_3,_1>_>).
                    m_storage.m_data.array[0] + 1) &&
         ((lower_vertex->super_PlainObjectBase<Eigen::Matrix<int,_3,_1,_0,_3,_1>_>).m_storage.m_data
          .array[0] + -1 <= iVar1)) &&
        (iVar1 = (__x->super_PlainObjectBase<Eigen::Matrix<int,_3,_1,_0,_3,_1>_>).m_storage.m_data.
                 array[1],
        iVar1 <= (upper_vertex->super_PlainObjectBase<Eigen::Matrix<int,_3,_1,_0,_3,_1>_>).m_storage
                 .m_data.array[1] + 1)) &&
       ((((lower_vertex->super_PlainObjectBase<Eigen::Matrix<int,_3,_1,_0,_3,_1>_>).m_storage.m_data
          .array[1] + -1 <= iVar1 &&
         (iVar1 = (__x->super_PlainObjectBase<Eigen::Matrix<int,_3,_1,_0,_3,_1>_>).m_storage.m_data.
                  array[2],
         iVar1 <= (upper_vertex->super_PlainObjectBase<Eigen::Matrix<int,_3,_1,_0,_3,_1>_>).
                  m_storage.m_data.array[2] + 1)) &&
        ((lower_vertex->super_PlainObjectBase<Eigen::Matrix<int,_3,_1,_0,_3,_1>_>).m_storage.m_data.
         array[2] + -1 <= iVar1)))) {
      std::
      vector<Eigen::Matrix<int,_3,_1,_0,_3,_1>,_std::allocator<Eigen::Matrix<int,_3,_1,_0,_3,_1>_>_>
      ::push_back(obstacles,__x);
    }
    __x = __x + 1;
  } while( true );
}

Assistant:

int RGProblem::getInnerObstacles(const Eigen::Vector3i &upper_vertex, const Eigen::Vector3i &lower_vertex, std::vector<Eigen::Vector3i> *obstacles) const
{
  obstacles->clear();

  for (auto it = this->obstacle_pts.cbegin(); it != this->obstacle_pts.cend(); ++it)
  {
    if ( (it->x() <= upper_vertex.x() + 1) && (it->x() >= lower_vertex.x() - 1)
    && (it->y() <= upper_vertex.y() + 1) && (it->y() >= lower_vertex.y() - 1)
    && (it->z() <= upper_vertex.z() + 1) && (it->z() >= lower_vertex.z() - 1) )
      obstacles->push_back(*it);
  }
}